

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O2

char * glslang::TQualifier::getLayoutPackingString(TLayoutPacking packing)

{
  if (packing - ElpShared < 5) {
    return &DAT_005f4418 + *(int *)(&DAT_005f4418 + (ulong)(packing - ElpShared) * 4);
  }
  return "none";
}

Assistant:

static const char* getLayoutPackingString(TLayoutPacking packing)
    {
        switch (packing) {
        case ElpStd140:   return "std140";
        case ElpPacked:   return "packed";
        case ElpShared:   return "shared";
        case ElpStd430:   return "std430";
        case ElpScalar:   return "scalar";
        default:          return "none";
        }
    }